

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  GenericTypeHandler<google::protobuf::Message> *this_00;
  LogMessage *other;
  GenericTypeHandler<google::protobuf::Message> *from;
  Message *to;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->current_size_ < 1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x714);
    other = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  pRVar3 = this->rep_;
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + -1;
  this_00 = (GenericTypeHandler<google::protobuf::Message> *)pRVar3->elements[(long)iVar1 + -1];
  iVar2 = pRVar3->allocated_size;
  pRVar3->allocated_size = iVar2 + -1;
  if (iVar1 < iVar2) {
    pRVar3->elements[(long)iVar1 + -1] = pRVar3->elements[(long)iVar2 + -1];
  }
  from = this_00;
  if (this->arena_ != (Arena *)0x0) {
    from = (GenericTypeHandler<google::protobuf::Message> *)
           GenericTypeHandler<google::protobuf::Message>::NewFromPrototype
                     ((Message *)this_00,(Arena *)0x0);
    GenericTypeHandler<google::protobuf::Message>::Merge(this_00,(Message *)from,to);
  }
  return (Type *)from;
}

Assistant:

inline typename TypeHandler::Type*
RepeatedPtrFieldBase::ReleaseLastInternal(google::protobuf::internal::true_type) {
  // First, release an element.
  typename TypeHandler::Type* result = UnsafeArenaReleaseLast<TypeHandler>();
  // Now perform a copy if we're on an arena.
  Arena* arena = GetArenaNoVirtual();
  if (arena == NULL) {
    return result;
  } else {
    typename TypeHandler::Type* new_result =
        TypeHandler::NewFromPrototype(result, NULL);
    TypeHandler::Merge(*result, new_result);
    return new_result;
  }
}